

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::clear
          (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this)

{
  Entry *S;
  
  S = (Entry *)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
               super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
               super_SmallVectorBase.BeginX;
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range
            (S,S + (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                   super_SmallVectorBase.Size);
  (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size = 0;
  return;
}

Assistant:

void clear() {
    this->destroy_range(this->begin(), this->end());
    this->Size = 0;
  }